

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidgetItem *other)

{
  Data *pDVar1;
  QTreeWidgetItemPrivate *pQVar2;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_0081e7f0;
  this->rtti = 0;
  pDVar1 = (other->values).d.d;
  (this->values).d.d = pDVar1;
  (this->values).d.ptr = (other->values).d.ptr;
  (this->values).d.size = (other->values).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->view = (QTreeWidget *)0x0;
  pQVar2 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar2->q = this;
  (pQVar2->display).d.d = (Data *)0x0;
  (pQVar2->display).d.ptr = (QVariant *)0x0;
  (pQVar2->display).d.size = 0;
  pQVar2->field_0x20 = pQVar2->field_0x20 & 0xf8;
  pQVar2->rowGuess = -1;
  pQVar2->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar2;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (other->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i;
  QArrayDataPointer<QVariant>::operator=(&(pQVar2->display).d,&(other->d->display).d);
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(const QTreeWidgetItem &other)
    : rtti(Type),
      values(other.values),
      d(new QTreeWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
    d->display = other.d->display;
}